

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::
       MessageSize<google::protobuf::FileDescriptorProto>(FileDescriptorProto *value)

{
  size_t sVar1;
  FileDescriptorProto *in_stack_000000a8;
  
  FileDescriptorProto::ByteSizeLong(in_stack_000000a8);
  sVar1 = LengthDelimitedSize((size_t)value);
  return sVar1;
}

Assistant:

inline size_t WireFormatLite::MessageSize(const MessageType& value) {
  return LengthDelimitedSize(value.ByteSizeLong());
}